

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void Fill_SSE2(uint8_t *dst,int value,int size)

{
  int in_EDX;
  byte in_SIL;
  uint8_t *in_RDI;
  int j;
  int local_14;
  
  if (in_EDX == 4) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      memset(in_RDI + (local_14 << 5),(uint)in_SIL,4);
    }
  }
  else if (in_EDX == 8) {
    Put8x8uv_SSE2(in_SIL,in_RDI);
  }
  else {
    Put16_SSE2(in_SIL,in_RDI);
  }
  return;
}

Assistant:

static WEBP_INLINE void Fill_SSE2(uint8_t* dst, int value, int size) {
  if (size == 4) {
    int j;
    for (j = 0; j < 4; ++j) {
      memset(dst + j * BPS, value, 4);
    }
  } else if (size == 8) {
    Put8x8uv_SSE2(value, dst);
  } else {
    Put16_SSE2(value, dst);
  }
}